

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<pybind11::handle>::load_impl_sequence<0ul>
          (argument_loader<pybind11::handle> *this,long call)

{
  handle hVar1;
  
  hVar1.m_ptr = *(PyObject **)*(long *)(call + 8);
  std::vector<bool,_std::allocator<bool>_>::operator[]
            ((vector<bool,_std::allocator<bool>_> *)(call + 0x20),0);
  (this->argcasters).super__Tuple_impl<0UL,_pybind11::detail::type_caster<pybind11::handle,_void>_>.
  super__Head_base<0UL,_pybind11::detail::type_caster<pybind11::handle,_void>,_false>._M_head_impl.
  super_pyobject_caster<pybind11::handle>.value.m_ptr = hVar1.m_ptr;
  return hVar1.m_ptr != (PyObject *)0x0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }